

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long_long&,unsigned_long_long&>&,char_const(&)[19],unsigned_long_long&,unsigned_long_long&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<unsigned_long_long_&,_unsigned_long_long_&> *params,char (*params_1) [19],
          unsigned_long_long *params_2,unsigned_long_long *params_3)

{
  long lVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined4 in_register_00000014;
  ArrayPtr<const_char> *params_00;
  unsigned_long_long *value;
  CappedArray<char,_26UL> *params_01;
  unsigned_long_long *value_00;
  CappedArray<char,_26UL> *params_02;
  long lVar4;
  String argValues [4];
  size_t *psVar5;
  undefined8 uVar6;
  CappedArray<char,_26UL> local_c0;
  size_t local_98;
  char local_90 [8];
  char acStack_88 [8];
  String local_80;
  String local_68;
  String local_50;
  
  this->exception = (Exception *)0x0;
  _::operator*(&local_c0,params,CONCAT44(in_register_00000014,line));
  local_98 = local_c0.currentSize;
  local_90[0] = local_c0.content[0];
  local_90[1] = local_c0.content[1];
  local_90[2] = local_c0.content[2];
  local_90[3] = local_c0.content[3];
  local_90[4] = local_c0.content[4];
  local_90[5] = local_c0.content[5];
  local_90[6] = local_c0.content[6];
  local_90[7] = local_c0.content[7];
  acStack_88[0] = local_c0.content[8];
  acStack_88[1] = local_c0.content[9];
  acStack_88[2] = local_c0.content[10];
  acStack_88[3] = local_c0.content[0xb];
  acStack_88[4] = local_c0.content[0xc];
  acStack_88[5] = local_c0.content[0xd];
  acStack_88[6] = local_c0.content[0xe];
  acStack_88[7] = local_c0.content[0xf];
  local_c0.content._0_8_ = strlen(*params_1);
  local_c0.currentSize = (size_t)params_1;
  concat<kj::ArrayPtr<char_const>>(&local_80,(_ *)&local_c0,params_00);
  toCharSequence<unsigned_long_long&>(&local_c0,(kj *)params_2,value);
  concat<kj::CappedArray<char,26ul>>(&local_68,(_ *)&local_c0,params_01);
  toCharSequence<unsigned_long_long&>(&local_c0,(kj *)params_3,value_00);
  concat<kj::CappedArray<char,26ul>>(&local_50,(_ *)&local_c0,params_02);
  psVar5 = &local_98;
  uVar6 = 4;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x48;
  do {
    lVar1 = *(long *)((long)&local_98 + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)(local_90 + lVar4);
      *(undefined8 *)((long)&local_98 + lVar4) = 0;
      pcVar3 = local_90 + lVar4;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      (**(code **)**(undefined8 **)(acStack_88 + lVar4))
                (*(undefined8 **)(acStack_88 + lVar4),lVar1,1,uVar2,uVar2,0,psVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}